

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall ManySubcommands::ManySubcommands(ManySubcommands *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  App *pAVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  allocator local_1db;
  allocator local_1da;
  allocator local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0 [32];
  string local_190 [32];
  iterator local_170;
  size_type local_168;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  ManySubcommands *local_10;
  ManySubcommands *this_local;
  
  local_10 = this;
  TApp::TApp(&this->super_TApp);
  (this->super_TApp)._vptr_TApp = (_func_int **)&PTR__ManySubcommands_00389dc8;
  this->sub1 = (App *)0x0;
  this->sub2 = (App *)0x0;
  this->sub3 = (App *)0x0;
  this->sub4 = (App *)0x0;
  pAVar1 = &(this->super_TApp).app;
  CLI::App::allow_extras(pAVar1,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"sub1",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"",&local_69);
  pAVar1 = CLI::App::add_subcommand(pAVar1,&local_30,&local_68);
  this->sub1 = pAVar1;
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"sub2",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"",&local_b9);
  pAVar1 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_90,&local_b8);
  this->sub2 = pAVar1;
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"sub3",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"",&local_109);
  pAVar1 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_e0,&local_108);
  this->sub3 = pAVar1;
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"sub4",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"",&local_159);
  pAVar1 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_130,&local_158);
  this->sub4 = pAVar1;
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_1d8 = &local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"sub1",&local_1d9);
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"sub2",&local_1da);
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"sub3",&local_1db);
  local_170 = &local_1d0;
  local_168 = 3;
  __l._M_len = 3;
  __l._M_array = local_170;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170;
  do {
    local_2a0 = local_2a0 + -1;
    std::__cxx11::string::~string((string *)local_2a0);
  } while (local_2a0 != &local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1db);
  std::allocator<char>::~allocator((allocator<char> *)&local_1da);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  return;
}

Assistant:

ManySubcommands() {
        app.allow_extras();
        sub1 = app.add_subcommand("sub1");
        sub2 = app.add_subcommand("sub2");
        sub3 = app.add_subcommand("sub3");
        sub4 = app.add_subcommand("sub4");
        args = {"sub1", "sub2", "sub3"};
    }